

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O3

void __thiscall
charls::jls_codec<charls::lossless_traits<charls::quad<unsigned_char>,_8>,_charls::decoder_strategy>
::decode_lines(jls_codec<charls::lossless_traits<charls::quad<unsigned_char>,_8>,_charls::decoder_strategy>
               *this)

{
  pixel_type *ppVar1;
  undefined8 *puVar2;
  uint uVar3;
  process_line *ppVar4;
  uint32_t uVar5;
  pixel_type *ppVar6;
  pixel_type *ppVar7;
  quad<unsigned_char> *__tmp;
  int iVar8;
  size_type sVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  uint32_t uVar13;
  ulong uVar14;
  size_type __n;
  vector<int,_std::allocator<int>_> run_index;
  vector<charls::quad<unsigned_char>,_std::allocator<charls::quad<unsigned_char>_>_> line_buffer;
  allocator_type local_81;
  uint32_t local_80;
  int local_7c;
  vector<int,_std::allocator<int>_> local_78;
  ulong local_60;
  vector<charls::quad<unsigned_char>,_std::allocator<charls::quad<unsigned_char>_>_> local_58;
  long local_40;
  long local_38;
  
  uVar14 = (ulong)(this->width_ + 4);
  iVar8 = 1;
  if ((this->super_decoder_strategy).parameters_.interleave_mode == Line) {
    iVar8 = (this->super_decoder_strategy).frame_info_.component_count;
  }
  __n = (size_type)iVar8;
  lVar12 = __n * uVar14;
  std::vector<charls::quad<unsigned_char>,_std::allocator<charls::quad<unsigned_char>_>_>::vector
            (&local_58,lVar12 * 2,(allocator_type *)&local_78);
  std::vector<int,_std::allocator<int>_>::vector(&local_78,__n,&local_81);
  local_40 = -lVar12;
  uVar13 = 0;
  local_7c = iVar8;
  local_38 = lVar12;
  while( true ) {
    uVar5 = (this->super_decoder_strategy).frame_info_.height;
    uVar3 = uVar5 - uVar13;
    if (this->restart_interval_ < uVar5 - uVar13) {
      uVar3 = this->restart_interval_;
    }
    uVar10 = (ulong)uVar3;
    if (uVar3 != 0) {
      local_80 = uVar3 + uVar13;
      iVar11 = 0;
      local_60 = uVar10;
      do {
        ppVar1 = local_58.
                 super__Vector_base<charls::quad<unsigned_char>,_std::allocator<charls::quad<unsigned_char>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1;
        this->previous_line_ = ppVar1;
        ppVar7 = local_58.
                 super__Vector_base<charls::quad<unsigned_char>,_std::allocator<charls::quad<unsigned_char>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + local_38 + 1;
        this->current_line_ = ppVar7;
        ppVar6 = ppVar1;
        if ((uVar13 & 1) != 0) {
          this->previous_line_ = ppVar7;
          this->current_line_ = ppVar1;
          ppVar6 = ppVar7;
          ppVar7 = ppVar1;
        }
        if (iVar8 != 0) {
          sVar9 = 0;
          do {
            this->run_index_ =
                 local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[sVar9];
            ppVar6[this->width_] = ppVar6[this->width_ - 1];
            this->current_line_[-1] = *this->previous_line_;
            do_line(this,(quad<unsigned_char> *)0x0);
            local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[sVar9] = this->run_index_;
            ppVar6 = this->previous_line_ + uVar14;
            this->previous_line_ = ppVar6;
            ppVar7 = this->current_line_ + uVar14;
            this->current_line_ = ppVar7;
            sVar9 = sVar9 + 1;
            uVar10 = local_60;
            iVar8 = local_7c;
          } while (__n != sVar9);
        }
        uVar3 = (this->rect_).Y;
        if ((uVar3 <= uVar13) && (uVar13 < uVar3 + (this->rect_).Height)) {
          ppVar4 = (this->super_decoder_strategy).process_line_._M_t.
                   super___uniq_ptr_impl<charls::process_line,_std::default_delete<charls::process_line>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_charls::process_line_*,_std::default_delete<charls::process_line>_>
                   .super__Head_base<0UL,_charls::process_line_*,_false>._M_head_impl;
          (*ppVar4->_vptr_process_line[2])
                    (ppVar4,ppVar7 + (this->rect_).X + local_40,(long)(this->rect_).Width,uVar14);
          uVar10 = local_60;
        }
        iVar11 = iVar11 + 1;
        uVar13 = uVar13 + 1;
      } while (iVar11 != (int)uVar10);
      uVar5 = (this->super_decoder_strategy).frame_info_.height;
      uVar13 = local_80;
    }
    if (uVar13 == uVar5) break;
    read_restart_marker(this);
    this->restart_interval_counter_ = this->restart_interval_counter_ + 1 & 7;
    decoder_strategy::reset(&this->super_decoder_strategy);
    if (local_58.
        super__Vector_base<charls::quad<unsigned_char>,_std::allocator<charls::quad<unsigned_char>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_58.
        super__Vector_base<charls::quad<unsigned_char>,_std::allocator<charls::quad<unsigned_char>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      memset(local_58.
             super__Vector_base<charls::quad<unsigned_char>,_std::allocator<charls::quad<unsigned_char>_>_>
             ._M_impl.super__Vector_impl_data._M_start,0,
             ((long)local_58.
                    super__Vector_base<charls::quad<unsigned_char>,_std::allocator<charls::quad<unsigned_char>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish +
              (-4 - (long)local_58.
                          super__Vector_base<charls::quad<unsigned_char>,_std::allocator<charls::quad<unsigned_char>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) & 0xfffffffffffffffcU) + 4);
    }
    if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      memset(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,0,
             ((long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish +
              (-4 - (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start) & 0xfffffffffffffffcU) + 4);
    }
    lVar12 = 0x90;
    do {
      puVar2 = (undefined8 *)((long)&(this->super_decoder_strategy)._vptr_decoder_strategy + lVar12)
      ;
      *puVar2 = 4;
      puVar2[1] = 0x100000000;
      lVar12 = lVar12 + 0x10;
    } while (lVar12 != 0x1760);
    (this->context_run_mode_)._M_elems[0].run_interruption_type_ = 0;
    (this->context_run_mode_)._M_elems[0].a_ = 4;
    (this->context_run_mode_)._M_elems[0].n_ = '\x01';
    (this->context_run_mode_)._M_elems[0].nn_ = '\0';
    (this->context_run_mode_)._M_elems[1].run_interruption_type_ = 1;
    (this->context_run_mode_)._M_elems[1].a_ = 4;
    (this->context_run_mode_)._M_elems[1].n_ = '\x01';
    (this->context_run_mode_)._M_elems[1].nn_ = '\0';
    this->run_index_ = 0;
  }
  decoder_strategy::end_scan(&this->super_decoder_strategy);
  if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_58.
      super__Vector_base<charls::quad<unsigned_char>,_std::allocator<charls::quad<unsigned_char>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.
                    super__Vector_base<charls::quad<unsigned_char>,_std::allocator<charls::quad<unsigned_char>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super__Vector_base<charls::quad<unsigned_char>,_std::allocator<charls::quad<unsigned_char>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super__Vector_base<charls::quad<unsigned_char>,_std::allocator<charls::quad<unsigned_char>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void decode_lines()
    {
        const uint32_t pixel_stride{width_ + 4U};
        const size_t component_count{
            parameters().interleave_mode == interleave_mode::line ? static_cast<size_t>(frame_info().component_count) : 1U};

        std::vector<pixel_type> line_buffer(component_count * pixel_stride * 2);
        std::vector<int32_t> run_index(component_count);

        for (uint32_t line{};;)
        {
            const uint32_t lines_in_interval{std::min(frame_info().height - line, restart_interval_)};

            for (uint32_t mcu{}; mcu < lines_in_interval; ++mcu, ++line)
            {
                previous_line_ = &line_buffer[1];
                current_line_ = &line_buffer[1 + static_cast<size_t>(component_count) * pixel_stride];
                if ((line & 1) == 1)
                {
                    std::swap(previous_line_, current_line_);
                }

                for (size_t component{}; component < component_count; ++component)
                {
                    run_index_ = run_index[component];

                    // initialize edge pixels used for prediction
                    previous_line_[width_] = previous_line_[width_ - 1];
                    current_line_[-1] = previous_line_[0];
                    do_line(static_cast<pixel_type*>(nullptr)); // dummy argument for overload resolution

                    run_index[component] = run_index_;
                    previous_line_ += pixel_stride;
                    current_line_ += pixel_stride;
                }

                // Only copy the line if it is part of the output rectangle.
                if (static_cast<uint32_t>(rect_.Y) <= line && line < static_cast<uint32_t>(rect_.Y + rect_.Height))
                {
                    Strategy::on_line_end(current_line_ + rect_.X - (static_cast<size_t>(component_count) * pixel_stride),
                                          rect_.Width,
                                          pixel_stride);
                }
            }

            if (line == frame_info().height)
                break;

            // At this point in the byte stream a restart marker should be present: process it.
            read_restart_marker();
            restart_interval_counter_ = (restart_interval_counter_ + 1) % jpeg_restart_marker_range;

            // After a restart marker it is required to reset the decoder.
            Strategy::reset();
            std::fill(line_buffer.begin(), line_buffer.end(), pixel_type{});
            std::fill(run_index.begin(), run_index.end(), 0);
            reset_parameters();
        }

        Strategy::end_scan();
    }